

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlValidateOneCdataElement(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem)

{
  xmlElementType xVar1;
  int iVar2;
  xmlNodePtr *ppxVar3;
  uint uVar4;
  xmlNodePtr pxVar5;
  int iVar6;
  
  iVar6 = 0;
  if ((ctxt != (xmlValidCtxtPtr)0x0) && (iVar6 = 0, doc->type == XML_ELEMENT_NODE)) {
    pxVar5 = doc->children;
    iVar6 = 1;
    while (pxVar5 != (xmlNodePtr)0x0) {
      xVar1 = pxVar5->type;
      if (XML_COMMENT_NODE < xVar1) {
LAB_0019298b:
        iVar6 = 0;
        break;
      }
      if ((0x198U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
        if (xVar1 != XML_ENTITY_REF_NODE) goto LAB_0019298b;
        if ((pxVar5->children == (_xmlNode *)0x0) || (pxVar5->children->children == (_xmlNode *)0x0)
           ) goto LAB_00192918;
        nodeVPush(ctxt,pxVar5);
        pxVar5 = pxVar5->children->children;
      }
      else {
LAB_00192918:
        while (pxVar5 = pxVar5->next, pxVar5 == (_xmlNode *)0x0) {
          iVar2 = ctxt->nodeNr;
          if ((long)iVar2 < 1) goto LAB_0019298d;
          uVar4 = iVar2 - 1;
          ctxt->nodeNr = uVar4;
          ppxVar3 = ctxt->nodeTab;
          if (iVar2 == 1) {
            pxVar5 = (xmlNodePtr)0x0;
          }
          else {
            pxVar5 = ppxVar3[(long)iVar2 + -2];
          }
          ctxt->node = pxVar5;
          pxVar5 = ppxVar3[uVar4];
          ppxVar3[uVar4] = (xmlNodePtr)0x0;
          if (pxVar5 == (xmlNodePtr)0x0) goto LAB_0019298d;
        }
      }
    }
LAB_0019298d:
    ctxt->nodeNr = 0;
    ctxt->nodeMax = 0;
    if (ctxt->nodeTab != (xmlNodePtr *)0x0) {
      (*xmlFree)(ctxt->nodeTab);
      ctxt->nodeTab = (xmlNodePtr *)0x0;
    }
  }
  return iVar6;
}

Assistant:

static int
xmlValidateOneCdataElement(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                           xmlNodePtr elem) {
    int ret = 1;
    xmlNodePtr cur, child;

    if ((ctxt == NULL) || (doc == NULL) || (elem == NULL) ||
        (elem->type != XML_ELEMENT_NODE))
	return(0);

    child = elem->children;

    cur = child;
    while (cur != NULL) {
	switch (cur->type) {
	    case XML_ENTITY_REF_NODE:
		/*
		 * Push the current node to be able to roll back
		 * and process within the entity
		 */
		if ((cur->children != NULL) &&
		    (cur->children->children != NULL)) {
		    nodeVPush(ctxt, cur);
		    cur = cur->children->children;
		    continue;
		}
		break;
	    case XML_COMMENT_NODE:
	    case XML_PI_NODE:
	    case XML_TEXT_NODE:
	    case XML_CDATA_SECTION_NODE:
		break;
	    default:
		ret = 0;
		goto done;
	}
	/*
	 * Switch to next element
	 */
	cur = cur->next;
	while (cur == NULL) {
	    cur = nodeVPop(ctxt);
	    if (cur == NULL)
		break;
	    cur = cur->next;
	}
    }
done:
    ctxt->nodeMax = 0;
    ctxt->nodeNr = 0;
    if (ctxt->nodeTab != NULL) {
	xmlFree(ctxt->nodeTab);
	ctxt->nodeTab = NULL;
    }
    return(ret);
}